

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_gnutar.c
# Opt level: O0

int archive_write_gnutar_finish_entry(archive_write *a)

{
  undefined8 *puVar1;
  int iVar2;
  long in_RDI;
  int ret;
  size_t unaff_retaddr;
  gnutar *gnutar;
  
  puVar1 = *(undefined8 **)(in_RDI + 0xd0);
  iVar2 = __archive_write_nulls((archive_write *)gnutar,unaff_retaddr);
  puVar1[1] = 0;
  *puVar1 = 0;
  return iVar2;
}

Assistant:

static int
archive_write_gnutar_finish_entry(struct archive_write *a)
{
	struct gnutar *gnutar;
	int ret;

	gnutar = (struct gnutar *)a->format_data;
	ret = __archive_write_nulls(a, (size_t)
	    (gnutar->entry_bytes_remaining + gnutar->entry_padding));
	gnutar->entry_bytes_remaining = gnutar->entry_padding = 0;
	return (ret);
}